

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BasicReporter::EndSection(BasicReporter *this,string *sectionName,Counts *assertions)

{
  ulong uVar1;
  ostream *poVar2;
  ulong *in_RDX;
  string *in_RSI;
  char *pcVar3;
  long in_RDI;
  Colour colour_1;
  Colour colour;
  SpanInfo *sectionSpan;
  pluralise *in_stack_fffffffffffffee8;
  Code _colourCode;
  Colour *in_stack_fffffffffffffef0;
  pluralise *this_00;
  allocator local_d1;
  string local_d0 [72];
  string *in_stack_ffffffffffffff78;
  Counts *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  BasicReporter *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [40];
  reference local_20;
  ulong *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = std::
             vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
             ::back((vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
                     *)in_stack_fffffffffffffef0);
  if ((local_20->emitted & 1U) != 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      poVar2 = std::operator<<(poVar2,"[End of section: \'");
      poVar2 = std::operator<<(poVar2,local_10);
      std::operator<<(poVar2,"\' ");
      _colourCode = (Code)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      if (local_18[1] == 0) {
        Colour::Colour(in_stack_fffffffffffffef0,_colourCode);
        poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
        pcVar3 = "";
        if (1 < *local_18) {
          pcVar3 = "All ";
        }
        std::operator<<(poVar2,pcVar3);
        this_00 = (pluralise *)*local_18;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,"assertion",&local_d1);
        pluralise::pluralise(this_00,(size_t)in_stack_fffffffffffffee8,(string *)0x1a7bd7);
        poVar2 = operator<<((ostream *)this_00,in_stack_fffffffffffffee8);
        std::operator<<(poVar2," passed");
        pluralise::~pluralise((pluralise *)0x1a7c0a);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        Colour::~Colour((Colour *)0x1a7c2b);
      }
      else {
        Colour::Colour(in_stack_fffffffffffffef0,_colourCode);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,"assertion",&local_49);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff80,"All ",(allocator *)&stack0xffffffffffffff7f);
        ReportCounts(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        Colour::~Colour((Colour *)0x1a7ab1);
      }
      poVar2 = ReporterConfig::stream((ReporterConfig *)(in_RDI + 0x10));
      poVar2 = std::operator<<(poVar2,"]\n");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  pop_back((vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
            *)0x1a7cf0);
  return;
}

Assistant:

virtual void EndSection( const std::string& sectionName, const Counts& assertions ) {

            SpanInfo& sectionSpan = m_sectionSpans.back();
            if( sectionSpan.emitted && !sectionSpan.name.empty() ) {
                m_config.stream() << "[End of section: '" << sectionName << "' ";

                if( assertions.failed ) {
                    Colour colour( Colour::ResultError );
                    ReportCounts( "assertion", assertions);
                }
                else {
                    Colour colour( Colour::ResultSuccess );
                    m_config.stream()   << ( assertions.passed > 1 ? "All " : "" )
                                        << pluralise( assertions.passed, "assertion" ) << " passed" ;
                }
                m_config.stream() << "]\n" << std::endl;
            }
            m_sectionSpans.pop_back();
        }